

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O3

bool __thiscall xy_rect::hit(xy_rect *this,ray *r,double t0,double t1,hit_record *rec)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  double dVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar8;
  double dVar9;
  double dVar10;
  
  dVar10 = (this->k - (r->orig).e[2]) / (r->dir).e[2];
  bVar2 = false;
  if ((t0 <= dVar10) && (dVar10 <= t1)) {
    dVar4 = (r->dir).e[0] * dVar10 + (r->orig).e[0];
    dVar7 = (r->dir).e[1] * dVar10 + (r->orig).e[1];
    dVar9 = this->x0;
    if ((dVar4 < dVar9) ||
       (((this->x1 < dVar4 || (dVar1 = this->y0, dVar7 < dVar1)) || (this->y1 < dVar7)))) {
      bVar2 = false;
    }
    else {
      auVar5._0_8_ = dVar4 - dVar9;
      auVar5._8_8_ = dVar7 - dVar1;
      auVar6._8_8_ = this->y1 - dVar1;
      auVar6._0_8_ = this->x1 - dVar9;
      auVar6 = divpd(auVar5,auVar6);
      rec->u = (double)auVar6._0_8_;
      rec->v = (double)auVar6._8_8_;
      rec->t = dVar10;
      dVar9 = (r->dir).e[0] * 0.0 + (r->dir).e[1] * 0.0 + (r->dir).e[2];
      rec->front_face = dVar9 < 0.0;
      uVar3 = (uint)(dVar9 < 0.0);
      uVar8 = (uint)((long)((ulong)uVar3 << 0x3f) >> 0x3f);
      uVar3 = ~(uint)((long)((ulong)uVar3 << 0x3f) >> 0x3f) & 0x80000000;
      *(undefined4 *)(rec->normal).e = 0;
      *(uint *)((long)(rec->normal).e + 4) = uVar3;
      *(undefined4 *)((rec->normal).e + 1) = 0;
      *(uint *)((long)(rec->normal).e + 0xc) = uVar3;
      *(undefined4 *)((rec->normal).e + 2) = 0;
      *(uint *)((long)(rec->normal).e + 0x14) = ~uVar8 & 0xbff00000 | uVar8 & 0x3ff00000;
      (rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(this->mp).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      dVar9 = (r->dir).e[2];
      dVar4 = (r->orig).e[2];
      dVar7 = (r->orig).e[1];
      dVar1 = (r->dir).e[1];
      (rec->p).e[0] = dVar10 * (r->dir).e[0] + (r->orig).e[0];
      (rec->p).e[1] = dVar10 * dVar1 + dVar7;
      (rec->p).e[2] = dVar10 * dVar9 + dVar4;
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool xy_rect::hit(const ray& r, double t0, double t1, hit_record& rec) const {
    auto t = (k-r.origin().z()) / r.direction().z();
    if (t < t0 || t > t1)
        return false;
    auto x = r.origin().x() + t*r.direction().x();
    auto y = r.origin().y() + t*r.direction().y();
    if (x < x0 || x > x1 || y < y0 || y > y1)
        return false;
    rec.u = (x-x0)/(x1-x0);
    rec.v = (y-y0)/(y1-y0);
    rec.t = t;
    vec3 outward_normal = vec3(0, 0, 1);
    rec.set_face_normal(r, outward_normal);
    rec.mat_ptr = mp;
    rec.p = r.at(t);
    return true;
}